

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O0

ion_cursor_status_t bpptree_next(ion_dict_cursor_t *cursor,ion_record_t *record)

{
  ion_dictionary_parent_t *piVar1;
  ion_boolean_t iVar2;
  ion_bpp_err_t iVar3;
  bool bVar4;
  ion_bpp_err_t bErr_1;
  ion_bpp_err_t bErr;
  ion_boolean_t is_valid;
  ion_bpptree_t *bpptree;
  ion_bpp_cursor_t *bCursor;
  ion_record_t *record_local;
  ion_dict_cursor_t *cursor_local;
  
  piVar1 = cursor->dictionary->instance;
  if (cursor->status == '\x03') {
    cursor_local._7_1_ = cursor->status;
  }
  else if (cursor->status == '\x01') {
    cursor_local._7_1_ = cursor->status;
  }
  else if ((cursor->status == '\x02') || (cursor->status == '\x04')) {
    if (cursor->status == '\x04') {
      bVar4 = true;
      switch(cursor->predicate->type) {
      case '\0':
        bVar4 = cursor[1].dictionary != (ion_dictionary_t *)0xffffffffffffffff;
        break;
      case '\x01':
        if ((cursor[1].dictionary == (ion_dictionary_t *)0xffffffffffffffff) &&
           ((iVar3 = b_find_next_key(*(ion_bpp_handle_t *)(piVar1 + 1),*(void **)(cursor + 1),
                                     (ion_bpp_external_address_t *)&cursor[1].dictionary),
            iVar3 != bErrOk ||
            (iVar2 = test_predicate(cursor,*(ion_key_t *)(cursor + 1)), iVar2 == '\0')))) {
          bVar4 = false;
        }
        break;
      case '\x02':
        if (cursor[1].dictionary == (ion_dictionary_t *)0xffffffffffffffff) {
          iVar3 = b_find_next_key(*(ion_bpp_handle_t *)(piVar1 + 1),*(void **)(cursor + 1),
                                  (ion_bpp_external_address_t *)&cursor[1].dictionary);
          bVar4 = iVar3 == bErrOk;
        }
        break;
      case '\x03':
      }
      if (!bVar4) {
        cursor->status = '\x01';
        return cursor->status;
      }
    }
    else {
      cursor->status = '\x04';
    }
    memcpy(record->key,*(void **)(cursor + 1),(long)(cursor->dictionary->instance->record).key_size)
    ;
    lfb_get((ion_lfb_t *)&piVar1[1].record.value_size,(ion_file_offset_t)cursor[1].dictionary,
            (cursor->dictionary->instance->record).value_size,(ion_byte_t *)record->value,
            (ion_file_offset_t *)&cursor[1].dictionary);
    cursor_local._7_1_ = cursor->status;
  }
  else {
    cursor_local._7_1_ = '\0';
  }
  return cursor_local._7_1_;
}

Assistant:

ion_cursor_status_t
bpptree_next(
	ion_dict_cursor_t	*cursor,
	ion_record_t		*record
) {
	ion_bpp_cursor_t	*bCursor	= (ion_bpp_cursor_t *) cursor;
	ion_bpptree_t		*bpptree	= (ion_bpptree_t *) cursor->dictionary->instance;

	if (cursor->status == cs_cursor_uninitialized) {
		return cursor->status;
	}
	else if (cursor->status == cs_end_of_results) {
		return cursor->status;
	}
	else if ((cursor->status == cs_cursor_initialized) || (cursor->status == cs_cursor_active)) {
		if (cursor->status == cs_cursor_active) {
			ion_boolean_t is_valid = boolean_true;

			switch (cursor->predicate->type) {
				case predicate_equality: {
					if (-1 == bCursor->offset) {
						/* End of results, we can quit */
						is_valid = boolean_false;
					}

					break;
				}

				case predicate_range: {
					/*do b_find_next_key then test_predicate */
					if (-1 == bCursor->offset) {
						ion_bpp_err_t bErr = b_find_next_key(bpptree->tree, bCursor->cur_key, &bCursor->offset);

						if ((bErrOk != bErr) || (boolean_false == test_predicate(cursor, bCursor->cur_key))) {
							is_valid = boolean_false;
						}
					}

					break;
				}

				case predicate_all_records: {
					if (-1 == bCursor->offset) {
						ion_bpp_err_t bErr = b_find_next_key(bpptree->tree, bCursor->cur_key, &bCursor->offset);

						if (bErrOk != bErr) {
							is_valid = boolean_false;
						}
					}

					break;
				}

				case predicate_predicate: {
					break;
				}
					/*No default since we can assume the predicate is valid. */
			}

			if (boolean_false == is_valid) {
				cursor->status = cs_end_of_results;
				return cursor->status;
			}
		}
		else {
			/* The status is cs_cursor_initialized */
			cursor->status = cs_cursor_active;
		}

		/* Get key */
		memcpy(record->key, bCursor->cur_key, cursor->dictionary->instance->record.key_size);

		/* Get value */
		lfb_get(&(bpptree->values), bCursor->offset, cursor->dictionary->instance->record.value_size, record->value, &bCursor->offset);
		return cursor->status;
	}

	return cs_invalid_cursor;
}